

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCatchExpr
          (ExprVisitorDelegate *this,TryExpr *expr)

{
  WatWriter *pWVar1;
  char *s;
  
  Dedent(this->writer_);
  pWVar1 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::Catch_Opcode);
  WritePutsSpace(pWVar1,s);
  pWVar1 = this->writer_;
  pWVar1->indent_ = pWVar1->indent_ + 2;
  (pWVar1->label_stack_).
  super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].label_type = Catch;
  WriteNewline(pWVar1,true);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCatchExpr(TryExpr* expr) {
  writer_->Dedent();
  writer_->WritePutsSpace(Opcode::Catch_Opcode.GetName());
  writer_->Indent();
  writer_->label_stack_.back().label_type = LabelType::Catch;
  writer_->WriteNewline(FORCE_NEWLINE);
  return Result::Ok;
}